

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void google::protobuf::DynamicMessageFactory::ConstructDefaultOneofInstance
               (Descriptor *type,uint32 *offsets,void *default_oneof_or_weak_instance)

{
  FieldDescriptor FVar1;
  int iVar2;
  CppType CVar3;
  float fVar4;
  OneofDescriptor *pOVar5;
  FieldDescriptor *this;
  char *pcVar6;
  FieldDescriptor *this_00;
  EnumValueDescriptor *this_01;
  string *default_value;
  int __c;
  long in_RDX;
  long in_RSI;
  Descriptor *in_RDI;
  double dVar7;
  ArenaStringPtr *asp;
  void *field_ptr;
  FieldDescriptor *field;
  int j;
  int i;
  FieldDescriptor *in_stack_ffffffffffffff60;
  uint local_20;
  int local_1c;
  
  for (local_1c = 0; iVar2 = Descriptor::oneof_decl_count(in_RDI), local_1c < iVar2;
      local_1c = local_1c + 1) {
    local_20 = 0;
    while( true ) {
      pOVar5 = Descriptor::oneof_decl(in_RDI,local_1c);
      iVar2 = OneofDescriptor::field_count(pOVar5);
      if (iVar2 <= (int)local_20) break;
      pOVar5 = Descriptor::oneof_decl(in_RDI,local_1c);
      pcVar6 = (char *)(ulong)local_20;
      this = OneofDescriptor::field(pOVar5,local_20);
      pcVar6 = FieldDescriptor::index(this,pcVar6,__c);
      this_00 = (FieldDescriptor *)(in_RDX + (ulong)*(uint *)(in_RSI + (long)(int)pcVar6 * 4));
      CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x558b99);
      switch(CVar3) {
      case CPPTYPE_INT32:
        fVar4 = (float)FieldDescriptor::default_value_int32(this);
        *(float *)this_00 = fVar4;
        break;
      case CPPTYPE_INT64:
        dVar7 = (double)FieldDescriptor::default_value_int64(this);
        *(double *)this_00 = dVar7;
        break;
      case CPPTYPE_UINT32:
        fVar4 = (float)FieldDescriptor::default_value_uint32(this);
        *(float *)this_00 = fVar4;
        break;
      case CPPTYPE_UINT64:
        dVar7 = (double)FieldDescriptor::default_value_uint64(this);
        *(double *)this_00 = dVar7;
        break;
      case CPPTYPE_DOUBLE:
        dVar7 = FieldDescriptor::default_value_double(this);
        *(double *)this_00 = dVar7;
        break;
      case CPPTYPE_FLOAT:
        fVar4 = FieldDescriptor::default_value_float(this);
        *(float *)this_00 = fVar4;
        break;
      case CPPTYPE_BOOL:
        FVar1 = (FieldDescriptor)FieldDescriptor::default_value_bool(this);
        *this_00 = FVar1;
        break;
      case CPPTYPE_ENUM:
        this_01 = FieldDescriptor::default_value_enum(in_stack_ffffffffffffff60);
        fVar4 = (float)EnumValueDescriptor::number(this_01);
        *(float *)this_00 = fVar4;
        break;
      case CPPTYPE_STRING:
        FieldDescriptor::options(this);
        FieldOptions::ctype((FieldOptions *)0x558d09);
        memset(this_00,0,8);
        default_value = FieldDescriptor::default_value_string_abi_cxx11_(this);
        internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)this_00,default_value);
        in_stack_ffffffffffffff60 = this_00;
        break;
      case CPPTYPE_MESSAGE:
        *(double *)this_00 = 0.0;
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void DynamicMessageFactory::ConstructDefaultOneofInstance(
    const Descriptor* type, const uint32 offsets[],
    void* default_oneof_or_weak_instance) {
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      void* field_ptr =
          reinterpret_cast<uint8*>(default_oneof_or_weak_instance) +
          offsets[field->index()];
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:               \
    new (field_ptr) TYPE(field->default_value_##TYPE()); \
    break;

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          new (field_ptr) int(field->default_value_enum()->number());
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING:
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(&field->default_value_string());
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE: {
          new (field_ptr) Message*(NULL);
          break;
        }
      }
    }
  }
}